

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

void Io_BlifSplitIntoTokens(Vec_Ptr_t *vTokens,char *pLine,char Stop)

{
  int iVar1;
  char *local_28;
  char *pCur;
  char Stop_local;
  char *pLine_local;
  Vec_Ptr_t *vTokens_local;
  
  for (local_28 = pLine; *local_28 != Stop; local_28 = local_28 + 1) {
    iVar1 = Io_BlifCharIsSpace(*local_28);
    if (iVar1 != 0) {
      *local_28 = '\0';
    }
  }
  Io_BlifCollectTokens(vTokens,pLine,local_28);
  return;
}

Assistant:

static void Io_BlifSplitIntoTokens( Vec_Ptr_t * vTokens, char * pLine, char Stop )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != Stop; pCur++ )
        if ( Io_BlifCharIsSpace(*pCur) )
            *pCur = 0;
    // collect tokens
    Io_BlifCollectTokens( vTokens, pLine, pCur );
}